

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzset_unlocked.c
# Opt level: O2

int zoneinit(state *sp,char *name)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  
  if ((sp == (state *)0x0) || ((char)sp->leapcnt != '\0')) {
    iVar3 = _PDCLIB_tzload((char *)sp,&_PDCLIB_lclmem,true);
    if (iVar3 == 0 || sp == (state *)0x0) {
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    else {
      if ((char)sp->leapcnt == ':') {
        return iVar3;
      }
      _Var2 = _PDCLIB_tzparse((char *)sp,&_PDCLIB_lclmem,false);
      if (!_Var2) {
        return iVar3;
      }
    }
    uVar8 = 0;
    uVar7 = (ulong)(uint)_PDCLIB_lclmem.charcnt;
    if (_PDCLIB_lclmem.charcnt < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pvVar5 = memchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789 :+-._",
                      (int)_PDCLIB_lclmem.chars[uVar8],0x45);
      if (pvVar5 == (void *)0x0) {
        _PDCLIB_lclmem.chars[uVar8] = '_';
      }
    }
    piVar9 = &_PDCLIB_lclmem.ttis[0].desigidx;
    iVar3 = _PDCLIB_lclmem.typecnt;
    for (lVar10 = 0; lVar10 < iVar3; lVar10 = lVar10 + 1) {
      iVar1 = *piVar9;
      sVar6 = strlen(_PDCLIB_lclmem.chars + iVar1);
      if ((0x10 < sVar6) &&
         (iVar4 = strcmp(_PDCLIB_lclmem.chars + iVar1,
                         "Local time zone must be set--see zic manual page"), iVar4 != 0)) {
        _PDCLIB_lclmem.chars[(long)iVar1 + 0x10] = '\0';
        iVar3 = _PDCLIB_lclmem.typecnt;
      }
      piVar9 = piVar9 + 4;
    }
  }
  else {
    _PDCLIB_lclmem.leapcnt = 0;
    _PDCLIB_lclmem.timecnt = 0;
    _PDCLIB_lclmem.typecnt = 0;
    _PDCLIB_lclmem.charcnt = 0;
    _PDCLIB_lclmem.goback = false;
    _PDCLIB_lclmem.goahead = false;
    _PDCLIB_init_ttinfo(_PDCLIB_lclmem.ttis,0,false,0);
    builtin_strncpy(_PDCLIB_lclmem.chars,"GMT",4);
    _PDCLIB_lclmem.defaulttype = 0;
  }
  return 0;
}

Assistant:

static int zoneinit( struct state * sp, char const * name )
{
    if (name && ! name[0])
    {
        /* User wants it fast rather than right. */
        sp->leapcnt = 0;        /* so, we're off a little */
        sp->timecnt = 0;
        sp->typecnt = 0;
        sp->charcnt = 0;
        sp->goback = sp->goahead = false;
        _PDCLIB_init_ttinfo( &sp->ttis[ 0 ], 0, false, 0 );
        strcpy( sp->chars, gmt );
        sp->defaulttype = 0;
        return 0;
    }
    else
    {
        int err = _PDCLIB_tzload( name, sp, true );

        if ( err != 0 && name && name[ 0 ] != ':' && _PDCLIB_tzparse( name, sp, false ) )
        {
            err = 0;
        }

        if ( err == 0 )
        {
            scrub_abbrs( sp );
        }

        return err;
    }
}